

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DecimalNegateBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *type;
  byte bVar1;
  long *plVar2;
  reference this_00;
  pointer pEVar3;
  reference pvVar4;
  LogicalType LStack_68;
  _Any_data local_50;
  code *local_40;
  
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&PTR__FunctionData_02451fd8;
  *(undefined1 *)(plVar2 + 1) = 0;
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  type = &pEVar3->return_type;
  bVar1 = DecimalType::GetWidth(type);
  if (bVar1 < 5) {
    LogicalType::LogicalType(&LStack_68,SMALLINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>
              ((scalar_function_t *)&local_50,&LStack_68);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  else if (bVar1 < 10) {
    LogicalType::LogicalType(&LStack_68,INTEGER);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>
              ((scalar_function_t *)&local_50,&LStack_68);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  else if (bVar1 < 0x13) {
    LogicalType::LogicalType(&LStack_68,BIGINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>
              ((scalar_function_t *)&local_50,&LStack_68);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  else {
    LogicalType::LogicalType(&LStack_68,HUGEINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>
              ((scalar_function_t *)&local_50,&LStack_68);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  LogicalType::~LogicalType(&LStack_68);
  LogicalType::Verify(type);
  pvVar4 = vector<duckdb::LogicalType,_true>::operator[]
                     (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  if (pvVar4 != type) {
    pvVar4->id_ = (pEVar3->return_type).id_;
    pvVar4->physical_type_ = (pEVar3->return_type).physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&pvVar4->type_info_,&(pEVar3->return_type).type_info_);
  }
  if (&(bound_function->super_BaseScalarFunction).return_type != type) {
    (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar3->return_type).id_;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
         (pEVar3->return_type).physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
               &(pEVar3->return_type).type_info_);
  }
  *(undefined8 *)this = 0;
  (**(code **)(*plVar2 + 8))(plVar2);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> DecimalNegateBind(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {

	auto bind_data = make_uniq<DecimalNegateBindData>();

	auto &decimal_type = arguments[0]->return_type;
	auto width = DecimalType::GetWidth(decimal_type);
	if (width <= Decimal::MAX_WIDTH_INT16) {
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::SMALLINT);
	} else if (width <= Decimal::MAX_WIDTH_INT32) {
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::INTEGER);
	} else if (width <= Decimal::MAX_WIDTH_INT64) {
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::BIGINT);
	} else {
		D_ASSERT(width <= Decimal::MAX_WIDTH_INT128);
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<NegateOperator>(LogicalTypeId::HUGEINT);
	}
	decimal_type.Verify();
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = decimal_type;
	return nullptr;
}